

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O1

void Omega_h::fill<signed_char>(Write<signed_char> *a,char val)

{
  int *piVar1;
  Alloc *pAVar2;
  LO n;
  type f;
  type local_20;
  
  pAVar2 = (a->shared_alloc_).alloc;
  local_20.a.shared_alloc_.alloc = pAVar2;
  if (((ulong)pAVar2 & 7) == 0 && pAVar2 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_20.a.shared_alloc_.alloc = (Alloc *)(pAVar2->size * 8 + 1);
    }
    else {
      pAVar2->use_count = pAVar2->use_count + 1;
    }
  }
  local_20.a.shared_alloc_.direct_ptr = (a->shared_alloc_).direct_ptr;
  if (((ulong)pAVar2 & 1) == 0) {
    n = (LO)pAVar2->size;
  }
  else {
    n = (LO)((ulong)pAVar2 >> 3);
  }
  local_20.val = val;
  parallel_for<Omega_h::fill<signed_char>(Omega_h::Write<signed_char>,signed_char)::_lambda(int)_1_>
            (n,&local_20,"Write(size,value)");
  pAVar2 = local_20.a.shared_alloc_.alloc;
  if (((ulong)local_20.a.shared_alloc_.alloc & 7) == 0 &&
      local_20.a.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_20.a.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_20.a.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  return;
}

Assistant:

void fill(Write<T> a, T val) {
  auto f = OMEGA_H_LAMBDA(LO i) { a[i] = val; };
  parallel_for(a.size(), f, "Write(size,value)");
}